

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessControlOutputVerticesCase::iterate
          (TessControlOutputVerticesCase *this)

{
  Context *pCVar1;
  RenderContext *renderCtx;
  TestLog *log;
  int iVar2;
  ProgramSources *pPVar3;
  undefined4 extraout_var;
  TestError *this_00;
  char *in_RCX;
  char *globalLayouts;
  char *globalLayouts_00;
  void *this_01;
  undefined1 *this_02;
  undefined1 auStack_368 [40];
  CallLogWrapper gl;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [40];
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  undefined1 local_1f0 [40];
  ResultCollector result;
  ShaderProgram program;
  
  this_02 = auStack_368;
  checkTessellationSupport((this->super_TessProgramQueryCase).super_TestCase.m_context);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  renderCtx = pCVar1->m_renderCtx;
  this_01 = (void *)0x0;
  memset(&result,0,0xac);
  Functional::(anonymous_namespace)::TessProgramQueryCase::getVertexSource_abi_cxx11_
            (&local_230,this_01);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_210,(_anonymous_namespace_ *)pCVar1,(Context *)local_230._M_dataplus._M_p,in_RCX
            );
  glu::VertexSource::VertexSource((VertexSource *)auStack_368,&local_210);
  pPVar3 = glu::ProgramSources::operator<<((ProgramSources *)&result,(ShaderSource *)auStack_368);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  Functional::(anonymous_namespace)::TessProgramQueryCase::getFragmentSource_abi_cxx11_
            (&local_270,this_02);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_250,(_anonymous_namespace_ *)pCVar1,(Context *)local_270._M_dataplus._M_p,in_RCX
            );
  glu::FragmentSource::FragmentSource((FragmentSource *)&gl,&local_250);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)&gl);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  Functional::(anonymous_namespace)::TessProgramQueryCase::getTessCtrlSource_abi_cxx11_
            (&local_2d8,"layout(vertices=4) out",globalLayouts);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2b8,(_anonymous_namespace_ *)pCVar1,(Context *)local_2d8._M_dataplus._M_p,in_RCX
            );
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_298,&local_2b8);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_298);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  Functional::(anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
            (&local_318,"layout(triangles) in",globalLayouts_00);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f8,(_anonymous_namespace_ *)pCVar1,(Context *)local_318._M_dataplus._M_p,in_RCX
            );
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_1f0,&local_2f8);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_1f0);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,pPVar3);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)(local_298 + 8));
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&gl.m_log);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)(auStack_368 + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&result);
  glu::operator<<(((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk != false) {
    iVar2 = (*((this->super_TessProgramQueryCase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    glu::CallLogWrapper::CallLogWrapper
              (&gl,(Functions *)CONCAT44(extraout_var,iVar2),
               ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log);
    log = ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
          )->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)auStack_368," // ERROR: ",(allocator<char> *)local_298);
    tcu::ResultCollector::ResultCollector(&result,log,(string *)auStack_368);
    std::__cxx11::string::~string((string *)auStack_368);
    gl.m_enableLog = true;
    deqp::gls::StateQueryUtil::verifyStateProgramInteger
              (&result,&gl,program.m_program.m_program,0x8e75,4,QUERY_PROGRAM_INTEGER);
    tcu::ResultCollector::setTestContextResult
              (&result,(this->super_TessProgramQueryCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx);
    tcu::ResultCollector::~ResultCollector(&result);
    glu::CallLogWrapper::~CallLogWrapper(&gl);
    glu::ShaderProgram::~ShaderProgram(&program);
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,"failed to build program",(allocator<char> *)auStack_368);
  tcu::TestError::TestError(this_00,(string *)&result);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TessControlOutputVerticesCase::IterateResult TessControlOutputVerticesCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::ShaderProgram program (m_context.getRenderContext(), glu::ProgramSources()
																<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource("layout(vertices=4) out").c_str()))
																<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource("layout(triangles) in").c_str())));

	m_testCtx.getLog() << program;
	if (!program.isOk())
		throw tcu::TestError("failed to build program");

	{
		glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
		tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

		gl.enableLogging(true);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 4, QUERY_PROGRAM_INTEGER);

		result.setTestContextResult(m_testCtx);
	}
	return STOP;
}